

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O0

void anon_unknown.dwarf_9a7c4::testSlerp(Quatf *q1,Quatf *q2)

{
  Quat<float> *in_RSI;
  Quat<float> *in_RDI;
  int m;
  int n;
  int in_stack_000000d0;
  int in_stack_000000d4;
  Quatf *in_stack_000000d8;
  Quatf *in_stack_000000e0;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < 0x11; local_18 = local_18 + 1) {
    Imath_3_2::Quat<float>::Quat(in_RSI,in_RDI);
    Imath_3_2::Quat<float>::Quat(in_RSI,in_RDI);
    testSlerp(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000d0);
  }
  return;
}

Assistant:

void
testSlerp (const Quatf q1, const Quatf q2)
{
    const int n = 16;

    for (int m = 0; m <= n; ++m)
        testSlerp (q1, q2, m, n);
}